

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapHills(Layer *l,int *out,int x,int z,int w,int h)

{
  int id;
  uint64_t salt;
  int mc_00;
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint64_t uVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int equals;
  int a12;
  int a01;
  int a21;
  int a10;
  int hillID;
  int m;
  int bn;
  int64_t idx;
  int b11;
  int a11;
  uint64_t cs;
  uint64_t ss;
  uint64_t st;
  int mc;
  int *riv;
  int err;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_9c;
  int local_94;
  long local_50;
  long local_48;
  int local_4;
  
  lVar2 = (long)(in_R8D + 2);
  lVar3 = (long)(in_R9D + 2);
  if (*(long *)(in_RDI + 0x40) != 0) {
    local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                        (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,lVar2,lVar3);
    if (local_4 == 0) {
      lVar4 = in_RSI + lVar2 * lVar3 * 4;
      local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x40))
                          (*(undefined8 *)(in_RDI + 0x40),lVar4,in_EDX + -1,in_ECX + -1,lVar2,lVar3)
      ;
      if (local_4 == 0) {
        mc_00 = (int)*(char *)(in_RDI + 8);
        salt = *(uint64_t *)(in_RDI + 0x18);
        for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
          for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
            id = *(int *)(in_RSI + (local_48 + 1 + (local_50 + 1) * lVar2) * 4);
            iVar1 = *(int *)(lVar4 + (local_48 + 1 + (local_50 + 1) * lVar2) * 4);
            lVar3 = local_48 + local_50 * in_R8D;
            local_94 = -1;
            if (9 < mc_00) {
              local_94 = (iVar1 + -2) % 0x1d;
            }
            if (((local_94 == 1) && (1 < iVar1)) && (iVar1 = isShallowOcean(id), iVar1 == 0)) {
              iVar1 = getMutated(mc_00,id);
              if (iVar1 < 1) {
                *(int *)(in_RSI + lVar3 * 4) = id;
              }
              else {
                *(int *)(in_RSI + lVar3 * 4) = iVar1;
              }
            }
            else {
              uVar5 = getChunkSeed(CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                   in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
              if ((local_94 == 0) || (iVar1 = mcFirstIsZero(uVar5,3), iVar1 != 0)) {
                in_stack_ffffffffffffff4c = id;
                local_9c = id;
                if (id == 0) {
                  if (9 < mc_00) {
                    local_9c = 0x18;
                  }
                }
                else if (id == 1) {
                  if (mc_00 < 10) {
                    local_9c = 4;
                  }
                  else {
                    uVar5 = mcStepSeed(uVar5,salt);
                    iVar1 = mcFirstIsZero(uVar5,3);
                    local_9c = 4;
                    if (iVar1 != 0) {
                      local_9c = 0x12;
                    }
                  }
                }
                else if (id == 2) {
                  local_9c = 0x11;
                }
                else if (id == 3) {
                  if (9 < mc_00) {
                    local_9c = 0x22;
                  }
                }
                else if (id == 4) {
                  local_9c = 0x12;
                }
                else if (id == 5) {
                  local_9c = 0x13;
                }
                else if (id == 0xc) {
                  local_9c = 0xd;
                }
                else if (id == 0x15) {
                  local_9c = 0x16;
                }
                else if (id == 0x1b) {
                  local_9c = 0x1c;
                }
                else if (id == 0x1d) {
                  local_9c = 1;
                }
                else if (id == 0x1e) {
                  local_9c = 0x1f;
                }
                else if (id == 0x20) {
                  local_9c = 0x21;
                }
                else if (id == 0x23) {
                  local_9c = 0x24;
                }
                else if (id == 0xa8) {
                  local_9c = 0xa9;
                }
                else {
                  iVar1 = areSimilar(in_stack_ffffffffffffff50,id,in_stack_ffffffffffffff48);
                  if (iVar1 == 0) {
                    iVar1 = isDeepOcean(id);
                    if (iVar1 != 0) {
                      uVar5 = mcStepSeed(uVar5,salt);
                      iVar1 = mcFirstIsZero(uVar5,3);
                      if (iVar1 != 0) {
                        uVar5 = mcStepSeed(uVar5,salt);
                        iVar1 = mcFirstIsZero(uVar5,2);
                        local_9c = 4;
                        if (iVar1 != 0) {
                          local_9c = 1;
                        }
                      }
                    }
                  }
                  else {
                    local_9c = 0x25;
                  }
                }
                if (((local_94 == 0) && (local_9c != id)) &&
                   (local_9c = getMutated(mc_00,local_9c), local_9c < 0)) {
                  local_9c = id;
                }
                if (local_9c == id) {
                  *(int *)(in_RSI + lVar3 * 4) = id;
                }
                else {
                  in_stack_ffffffffffffff54 =
                       *(undefined4 *)(in_RSI + (local_48 + 1 + (local_50 + 2) * lVar2) * 4);
                  in_stack_ffffffffffffff50 = 0;
                  iVar1 = areSimilar(0,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
                  if (iVar1 != 0) {
                    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1;
                  }
                  iVar1 = areSimilar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                     in_stack_ffffffffffffff48);
                  if (iVar1 != 0) {
                    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1;
                  }
                  iVar1 = areSimilar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                     in_stack_ffffffffffffff48);
                  if (iVar1 != 0) {
                    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1;
                  }
                  iVar1 = areSimilar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                     in_stack_ffffffffffffff48);
                  if (iVar1 != 0) {
                    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1;
                  }
                  if (in_stack_ffffffffffffff50 < (int)((mc_00 < 10) + 3)) {
                    *(int *)(in_RSI + lVar3 * 4) = id;
                  }
                  else {
                    *(int *)(in_RSI + lVar3 * 4) = local_9c;
                  }
                }
              }
              else {
                *(int *)(in_RSI + lVar3 * 4) = id;
              }
            }
          }
        }
        local_4 = 0;
      }
    }
    return local_4;
  }
  printf("mapHills() requires two parents! Use setupMultiLayer()\n");
  exit(1);
}

Assistant:

int mapHills(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    if unlikely(l->p2 == NULL)
    {
        printf("mapHills() requires two parents! Use setupMultiLayer()\n");
        exit(1);
    }